

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void av1_dr_prediction_z1_avx2
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int dx,int dy)

{
  int in_EDX;
  int in_stack_000000d8;
  int in_stack_000000dc;
  uint8_t *in_stack_000000e0;
  ptrdiff_t in_stack_000000e8;
  uint8_t *in_stack_000000f0;
  int in_stack_000000fc;
  int in_stack_000001d8;
  int in_stack_000001dc;
  uint8_t *in_stack_000001e0;
  ptrdiff_t in_stack_000001e8;
  uint8_t *in_stack_000001f0;
  int in_stack_000001fc;
  int in_stack_000003d8;
  int in_stack_000003dc;
  uint8_t *in_stack_000003e0;
  ptrdiff_t in_stack_000003e8;
  uint8_t *in_stack_000003f0;
  int in_stack_000003fc;
  int in_stack_000007f8;
  int in_stack_000007fc;
  uint8_t *in_stack_00000800;
  ptrdiff_t in_stack_00000808;
  uint8_t *in_stack_00000810;
  int in_stack_0000081c;
  
  if (in_EDX == 4) {
    dr_prediction_z1_4xN_avx2
              (in_stack_000000fc,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
               in_stack_000000dc,in_stack_000000d8);
  }
  else if (in_EDX == 8) {
    dr_prediction_z1_8xN_avx2
              (in_stack_000001fc,in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,
               in_stack_000001dc,in_stack_000001d8);
  }
  else if (in_EDX == 0x10) {
    dr_prediction_z1_16xN_avx2
              (in_stack_000003fc,in_stack_000003f0,in_stack_000003e8,in_stack_000003e0,
               in_stack_000003dc,in_stack_000003d8);
  }
  else if (in_EDX == 0x20) {
    dr_prediction_z1_32xN_avx2
              (in_stack_0000081c,in_stack_00000810,in_stack_00000808,in_stack_00000800,
               in_stack_000007fc,in_stack_000007f8);
  }
  else if (in_EDX == 0x40) {
    dr_prediction_z1_64xN_avx2
              (in_stack_000001fc,in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,
               in_stack_000001dc,in_stack_000001d8);
  }
  return;
}

Assistant:

void av1_dr_prediction_z1_avx2(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                               const uint8_t *above, const uint8_t *left,
                               int upsample_above, int dx, int dy) {
  (void)left;
  (void)dy;
  switch (bw) {
    case 4:
      dr_prediction_z1_4xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 8:
      dr_prediction_z1_8xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 16:
      dr_prediction_z1_16xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 32:
      dr_prediction_z1_32xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 64:
      dr_prediction_z1_64xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    default: break;
  }
  return;
}